

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::BriefUnitTestResultPrinter::OnTestPartResult
          (BriefUnitTestResultPrinter *this,TestPartResult *result)

{
  if (result->type_ != kSuccess) {
    PrintTestPartResult(result);
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void BriefUnitTestResultPrinter::OnTestPartResult(
    const TestPartResult& result) {
  switch (result.type()) {
    // If the test part succeeded, we don't need to do anything.
    case TestPartResult::kSuccess:
      return;
    default:
      // Print failure message from the assertion
      // (e.g. expected this and got that).
      PrintTestPartResult(result);
      fflush(stdout);
  }
}